

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasCustomLayer(Model *model)

{
  int iVar1;
  LayerCase LVar2;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  NeuralNetworkLayer *this_00;
  NeuralNetworkLayer *layer;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  Model *model_local;
  
  this = getNNSpec(model);
  if (this != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
    for (layer._4_4_ = 0;
        iVar1 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                          (this), layer._4_4_ < iVar1; layer._4_4_ = layer._4_4_ + 1) {
      this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                operator[](this,layer._4_4_);
      LVar2 = Specification::NeuralNetworkLayer::layer_case(this_00);
      if (LVar2 == kCustom) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CoreML::hasCustomLayer(const Specification::Model& model) {
    auto layers = getNNSpec(model);
    if (layers) {
        for (int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (layer.layer_case() == Specification::NeuralNetworkLayer::kCustom) {
                return true;
            }
        }
    }
    return false;
}